

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

bool __thiscall
cmQtAutoGenInitializer::GetQtExecutable
          (cmQtAutoGenInitializer *this,GenVarsT *genVars,string *executable,
          bool ignoreMissingTarget)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  byte bVar7;
  uint uVar8;
  char *pcVar9;
  cmMakefile *this_00;
  cmLocalGenerator *pcVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  cmGeneratorTarget *this_01;
  char *__s;
  string *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  string val;
  string prop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmListFileBacktrace local_90;
  cmListFileBacktrace lfbt;
  anon_class_16_2_c95d1c49 print_err;
  cmGeneratorExpression ge;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  prop._M_dataplus._M_p = (pointer)&prop.field_2;
  pcVar1 = (genVars->GenNameUpper->_M_dataplus)._M_p;
  psVar12 = &prop;
  print_err.this = this;
  print_err.genVars = genVars;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar12,pcVar1,pcVar1 + genVars->GenNameUpper->_M_string_length);
  std::__cxx11::string::append((char *)psVar12);
  pcVar9 = cmTarget::GetSafeProperty(this->Target->Target,&prop);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&val,pcVar9,(allocator<char> *)&__str_1);
  sVar5 = val._M_string_length;
  if (val._M_string_length != 0) {
    this_00 = cmTarget::GetMakefile(this->Target->Target);
    cmMakefile::GetBacktrace(this_00);
    local_90.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         lfbt.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_90.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = lfbt.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    if (lfbt.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (lfbt.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (lfbt.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (lfbt.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (lfbt.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    cmGeneratorExpression::cmGeneratorExpression(&ge,&local_90);
    if (local_90.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
    pcVar10 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"");
    local_50._8_8_ = 0;
    local_40._M_local_buf[0] = '\0';
    local_50._0_8_ = &local_40;
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)
               cge._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,pcVar10,
               &__str_1,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(string *)local_50);
    std::__cxx11::string::_M_assign((string *)&genVars->Executable);
    paVar13 = &__str_1.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._0_8_ != &local_40) {
      operator_delete((void *)local_50._0_8_,
                      CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar13) {
      operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
    }
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr(&cge);
    cmGeneratorExpression::~cmGeneratorExpression(&ge);
    if (lfbt.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (lfbt.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((genVars->Executable)._M_string_length == 0 && !ignoreMissingTarget) {
      __str_1._M_dataplus._M_p = (pointer)paVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str_1,prop._M_dataplus._M_p,
                 prop._M_dataplus._M_p + prop._M_string_length);
      std::__cxx11::string::append((char *)&__str_1);
      GetQtExecutable::anon_class_16_2_c95d1c49::operator()(&print_err,&__str_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar13) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      psVar12 = (string *)0x0;
    }
    else {
      p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
      p_Var11->_M_use_count = 1;
      p_Var11->_M_weak_count = 1;
      p_Var11->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0067ef50;
      p_Var11[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var11[1]._M_use_count = 0;
      p_Var11[1]._M_weak_count = 0;
      p_Var11[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var11[2]._M_use_count = 0;
      p_Var11[2]._M_weak_count = 0;
      p_Var11[4]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var11[4]._M_use_count = 0;
      p_Var11[4]._M_weak_count = 0;
      p_Var11[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var11[3]._M_use_count = 0;
      p_Var11[3]._M_weak_count = 0;
      *(_Atomic_word **)&p_Var11[1]._M_use_count = &p_Var11[2]._M_use_count;
      p_Var11[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      *(undefined1 *)&p_Var11[2]._M_use_count = 0;
      p_Var11[4]._M_use_count = 0;
      p_Var11[4]._M_weak_count = 0;
      p_Var11[3]._M_use_count = 0;
      p_Var11[3]._M_weak_count = 0;
      p_Var11[4]._vptr__Sp_counted_base = (_func_int **)0x0;
      (genVars->ExecutableFeatures).
      super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(p_Var11 + 1);
      p_Var2 = (genVars->ExecutableFeatures).
               super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (genVars->ExecutableFeatures).
      super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var11;
      psVar12 = (string *)0x1;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
    }
  }
  paVar13 = &prop.field_2;
  bVar7 = (byte)psVar12;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)val._M_dataplus._M_p != &val.field_2) {
    operator_delete(val._M_dataplus._M_p,val.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prop._M_dataplus._M_p != paVar13) {
    operator_delete(prop._M_dataplus._M_p,
                    CONCAT71(prop.field_2._M_allocated_capacity._1_7_,prop.field_2._M_local_buf[0])
                    + 1);
  }
  if (sVar5 == 0) {
    prop._M_string_length = 0;
    prop.field_2._M_local_buf[0] = '\0';
    uVar8 = (this->QtVersion).Major - 4;
    prop._M_dataplus._M_p = (pointer)paVar13;
    if (uVar8 < 3) {
      std::__cxx11::string::_M_replace
                ((ulong)&prop,0,(char *)0x0,
                 (ulong)(&DAT_00546e00 + *(int *)(&DAT_00546e00 + (ulong)uVar8 * 4)));
    }
    std::__cxx11::string::_M_append((char *)&prop,(ulong)(executable->_M_dataplus)._M_p);
    pcVar10 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    this_01 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar10,&prop);
    if (this_01 == (cmGeneratorTarget *)0x0) {
      if (ignoreMissingTarget) {
        p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
        p_Var11->_M_use_count = 1;
        p_Var11->_M_weak_count = 1;
        p_Var11->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0067ef50;
        p_Var11[1]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var11[1]._M_use_count = 0;
        p_Var11[1]._M_weak_count = 0;
        p_Var11[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var11[2]._M_use_count = 0;
        p_Var11[2]._M_weak_count = 0;
        p_Var11[4]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var11[4]._M_use_count = 0;
        p_Var11[4]._M_weak_count = 0;
        p_Var11[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var11[3]._M_use_count = 0;
        p_Var11[3]._M_weak_count = 0;
        *(_Atomic_word **)&p_Var11[1]._M_use_count = &p_Var11[2]._M_use_count;
        p_Var11[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        *(undefined1 *)&p_Var11[2]._M_use_count = 0;
        p_Var11[4]._M_use_count = 0;
        p_Var11[4]._M_weak_count = 0;
        p_Var11[3]._M_use_count = 0;
        p_Var11[3]._M_weak_count = 0;
        p_Var11[4]._vptr__Sp_counted_base = (_func_int **)0x0;
        (genVars->ExecutableFeatures).
        super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(p_Var11 + 1);
        p_Var2 = (genVars->ExecutableFeatures).
                 super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        (genVars->ExecutableFeatures).
        super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = p_Var11;
        bVar7 = 1;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
      }
      else {
        val._M_dataplus._M_p = (pointer)&val.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&val,"Could not find ","");
        std::__cxx11::string::_M_append((char *)&val,(ulong)(executable->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&val);
        std::__cxx11::string::_M_append((char *)&val,(ulong)prop._M_dataplus._M_p);
        GetQtExecutable::anon_class_16_2_c95d1c49::operator()(&print_err,&val);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)val._M_dataplus._M_p != &val.field_2) {
          operator_delete(val._M_dataplus._M_p,val.field_2._M_allocated_capacity + 1);
        }
        bVar7 = 0;
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&genVars->ExecutableTargetName);
      genVars->ExecutableTarget = this_01;
      bVar6 = cmGeneratorTarget::IsImported(this_01);
      if (bVar6) {
        __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&__str_1,"");
        cmGeneratorTarget::ImportedGetLocation(&val,this_01,&__str_1);
        std::__cxx11::string::operator=((string *)&genVars->Executable,(string *)&val);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)val._M_dataplus._M_p != &val.field_2) {
          operator_delete(val._M_dataplus._M_p,val.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        val._M_dataplus._M_p = (pointer)&val.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&val,"");
        __s = cmGeneratorTarget::GetLocation(this_01,&val);
        pcVar9 = (char *)(genVars->Executable)._M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)&genVars->Executable,0,pcVar9,(ulong)__s);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)val._M_dataplus._M_p != &val.field_2) {
          operator_delete(val._M_dataplus._M_p,val.field_2._M_allocated_capacity + 1);
        }
      }
    }
    paVar13 = &prop.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prop._M_dataplus._M_p != paVar13) {
      operator_delete(prop._M_dataplus._M_p,
                      CONCAT71(prop.field_2._M_allocated_capacity._1_7_,prop.field_2._M_local_buf[0]
                              ) + 1);
    }
    if (this_01 != (cmGeneratorTarget *)0x0) {
      prop._M_string_length = 0;
      prop.field_2._M_local_buf[0] = '\0';
      prop._M_dataplus._M_p = (pointer)paVar13;
      cmQtAutoGenGlobalInitializer::GetCompilerFeatures
                ((cmQtAutoGenGlobalInitializer *)&val,(string *)this->GlobalInitializer,executable,
                 &genVars->Executable);
      sVar5 = val._M_string_length;
      _Var4 = val._M_dataplus;
      val._M_dataplus._M_p = (pointer)0x0;
      val._M_string_length = 0;
      p_Var2 = (genVars->ExecutableFeatures).
               super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (genVars->ExecutableFeatures).
      super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var4._M_p;
      (genVars->ExecutableFeatures).
      super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if (val._M_string_length != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)val._M_string_length);
      }
      peVar3 = (genVars->ExecutableFeatures).
               super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar3 == (element_type *)0x0) {
        GetQtExecutable::anon_class_16_2_c95d1c49::operator()(&print_err,&prop);
        bVar7 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)prop._M_dataplus._M_p != paVar13) {
        operator_delete(prop._M_dataplus._M_p,
                        CONCAT71(prop.field_2._M_allocated_capacity._1_7_,
                                 prop.field_2._M_local_buf[0]) + 1);
      }
      bVar7 = peVar3 != (element_type *)0x0 | bVar7;
    }
  }
  return (bool)(bVar7 & 1);
}

Assistant:

bool cmQtAutoGenInitializer::GetQtExecutable(GenVarsT& genVars,
                                             const std::string& executable,
                                             bool ignoreMissingTarget) const
{
  auto print_err = [this, &genVars](std::string const& err) {
    std::string msg = genVars.GenNameUpper;
    msg += " for target ";
    msg += this->Target->GetName();
    msg += ": ";
    msg += err;
    cmSystemTools::Error(msg);
  };

  // Custom executable
  {
    std::string const prop = genVars.GenNameUpper + "_EXECUTABLE";
    std::string const val = this->Target->Target->GetSafeProperty(prop);
    if (!val.empty()) {
      // Evaluate generator expression
      {
        cmListFileBacktrace lfbt =
          this->Target->Target->GetMakefile()->GetBacktrace();
        cmGeneratorExpression ge(lfbt);
        std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(val);
        genVars.Executable =
          cge->Evaluate(this->Target->GetLocalGenerator(), "");
      }
      if (genVars.Executable.empty() && !ignoreMissingTarget) {
        print_err(prop + " evaluates to an empty value");
        return false;
      }

      // Create empty compiler features.
      genVars.ExecutableFeatures =
        std::make_shared<cmQtAutoGen::CompilerFeatures>();
      return true;
    }
  }

  // Find executable target
  {
    // Find executable target name
    std::string targetName;
    if (this->QtVersion.Major == 4) {
      targetName = "Qt4::";
    } else if (this->QtVersion.Major == 5) {
      targetName = "Qt5::";
    } else if (this->QtVersion.Major == 6) {
      targetName = "Qt6::";
    }
    targetName += executable;

    // Find target
    cmLocalGenerator* localGen = this->Target->GetLocalGenerator();
    cmGeneratorTarget* target = localGen->FindGeneratorTargetToUse(targetName);
    if (target != nullptr) {
      genVars.ExecutableTargetName = targetName;
      genVars.ExecutableTarget = target;
      if (target->IsImported()) {
        genVars.Executable = target->ImportedGetLocation("");
      } else {
        genVars.Executable = target->GetLocation("");
      }
    } else {
      if (ignoreMissingTarget) {
        // Create empty compiler features.
        genVars.ExecutableFeatures =
          std::make_shared<cmQtAutoGen::CompilerFeatures>();
        return true;
      }
      std::string err = "Could not find ";
      err += executable;
      err += " executable target ";
      err += targetName;
      print_err(err);
      return false;
    }
  }

  // Get executable features
  {
    std::string err;
    genVars.ExecutableFeatures = this->GlobalInitializer->GetCompilerFeatures(
      executable, genVars.Executable, err);
    if (!genVars.ExecutableFeatures) {
      print_err(err);
      return false;
    }
  }

  return true;
}